

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O0

gcstring * GenApi_3_4::TrimSpace(gcstring *s,istream *is)

{
  bool bVar1;
  char __c;
  char *pcVar2;
  ulong uVar3;
  gcstring *in_RDI;
  size_t ibegin;
  size_t iend;
  ios_base *in_stack_ffffffffffffff88;
  ulong uVar4;
  undefined4 in_stack_ffffffffffffff94;
  bool local_49;
  locale local_48 [31];
  byte local_29;
  locale local_28 [8];
  ulong local_20;
  ulong local_18;
  gcstring *local_8;
  
  local_8 = in_RDI;
  local_18 = (**(code **)(*(long *)in_RDI + 0x80))();
  local_20 = 0;
  while( true ) {
    local_29 = 0;
    local_49 = false;
    if (local_20 < local_18) {
      GenICam_3_4::gcstring::operator_cast_to_char_(local_8);
      std::ios_base::getloc(in_stack_ffffffffffffff88);
      local_29 = 1;
      local_49 = std::isspace<char>((char)((uint)in_stack_ffffffffffffff94 >> 0x18),
                                    (locale *)in_stack_ffffffffffffff88);
    }
    if ((local_29 & 1) != 0) {
      std::locale::~locale(local_28);
    }
    if (local_49 == false) break;
    local_20 = local_20 + 1;
  }
  do {
    local_18 = local_18 - 1;
    if (local_18 <= local_20) break;
    pcVar2 = GenICam_3_4::gcstring::operator_cast_to_char_(local_8);
    __c = pcVar2[local_18] >> 7;
    std::ios_base::getloc(in_stack_ffffffffffffff88);
    bVar1 = std::isspace<char>(__c,(locale *)in_stack_ffffffffffffff88);
    std::locale::~locale(local_48);
  } while (((bVar1 ^ 0xffU) & 1) == 0);
  uVar4 = local_18;
  uVar3 = (**(code **)(*(long *)local_8 + 0x80))();
  if (uVar4 < uVar3) {
    (**(code **)(*(long *)local_8 + 0xa0))(local_8,local_18 + 1,0xffffffffffffffff);
  }
  (**(code **)(*(long *)local_8 + 0xa0))(local_8,0,local_20);
  return local_8;
}

Assistant:

inline GENICAM_NAMESPACE::gcstring& TrimSpace( GENICAM_NAMESPACE::gcstring& s, std::istream& is )
    {
        size_t iend =s.length();
        size_t ibegin = 0;
        for (; ibegin < iend && std::isspace( s[ibegin], is.getloc() ); ++ibegin);
        for (--iend; ibegin < iend; --iend)
        {
            if (!std::isspace( s[iend], is.getloc() ))
                break;
        }
        if (iend < s.length())
        {
            s.erase(iend + 1);
        }
        s.erase( 0, ibegin );

        return s;
    }